

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_literal_string_only<toml::type_config>
            (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *v;
  string *this;
  allocator<char> local_301;
  string str;
  string_type val;
  string local_2c0;
  string local_2a0;
  region reg;
  location local_218;
  undefined1 local_1d0 [136];
  location first;
  error_info local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  local_a8;
  
  location::location(&first,loc);
  syntax::literal_string((sequence *)local_1d0,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)local_1d0,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_1d0 + 8));
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"toml::parse_literal_string: invalid string format",
               (allocator<char> *)&val);
    syntax::literal_string((sequence *)&str,&ctx->toml_spec_);
    location::location(&local_218,loc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_301);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_1d0,&local_2a0,(sequence *)&str,&local_218,&local_2c0);
    err<toml::error_info>((failure<toml::error_info> *)&local_100,(error_info *)local_1d0);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_100);
    error_info::~error_info(&local_100);
    error_info::~error_info((error_info *)local_1d0);
    std::__cxx11::string::~string((string *)&local_2c0);
    location::~location(&local_218);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&str._M_string_length);
    this = &local_2a0;
  }
  else {
    region::as_string_abi_cxx11_(&str,&reg);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,1);
    val._M_dataplus._M_p = (pointer)&val.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&val,str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)local_1d0,&val,&reg);
    ok<std::pair<std::__cxx11::string,toml::detail::region>>
              ((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_a8,(toml *)local_1d0,v);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(success_type *)&local_a8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::~pair(&local_a8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
             *)local_1d0);
    std::__cxx11::string::~string((string *)&val);
    this = &str;
  }
  std::__cxx11::string::~string((string *)this);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_literal_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_literal_string: "
            "invalid string format",
            syntax::literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\'');
    str.pop_back();
    assert(str.at(0) == '\'');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(std::make_pair(std::move(val), std::move(reg)));
}